

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall
tonk::Connection::resetTimers
          (Connection *this,uint32_t noDataTimeoutUsec,bool connectionEstablished)

{
  uint64_t nowUsec_00;
  uint uVar1;
  byte in_DL;
  uint in_ESI;
  LogStringBuffer *in_RDI;
  uint64_t nowUsec;
  uint64_t nowUsec_1;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffc58;
  LogStringBuffer *in_stack_fffffffffffffc60;
  __int_type_conflict in_stack_fffffffffffffc68;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffc70;
  LogStringBuffer *buffer_00;
  OutputWorker *this_00;
  uint local_34c [3];
  uint64_t local_340;
  char *local_330;
  uint *local_328;
  char *local_320;
  undefined1 *local_318;
  char *local_310;
  uint *local_308;
  char *local_300;
  undefined4 local_2f4;
  undefined1 *local_2f0;
  undefined4 local_2e4;
  undefined1 *local_2e0;
  undefined1 local_2c8 [16];
  ostream aoStack_2b8 [376];
  char *local_140;
  uint *local_138;
  char *local_130;
  undefined4 local_124;
  undefined1 *local_120;
  char *local_118;
  uint *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  uint *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  uint *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  uint *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  uint *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_34c[0] = in_ESI;
  local_340 = siamese::GetTimeUsec();
  std::__atomic_base<unsigned_long>::operator=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  nowUsec_00 = local_340;
  Timer::SetTimeoutUsec((Timer *)&in_RDI[0x82].field_0xd8,(ulong)local_34c[0],Stop);
  Timer::Start((Timer *)&in_RDI[0x82].field_0xd8,nowUsec_00);
  uVar1 = 500000;
  if ((in_DL & 1) != 0) {
    uVar1 = 2000000;
  }
  Timer::SetTimeoutUsec((Timer *)&in_RDI[0x82].field_0xf8,(ulong)uVar1,Restart);
  Timer::Start((Timer *)&in_RDI[0x82].field_0xf8,nowUsec_00);
  Timer::SetTimeoutUsec((Timer *)&in_RDI[0x82].field_0x118,50000,Restart);
  Timer::Start((Timer *)&in_RDI[0x82].field_0x118,nowUsec_00);
  Timer::SetTimeoutUsec
            ((Timer *)&in_RDI[0x82].field_0x138,
             (ulong)*(uint *)(*(long *)&in_RDI->field_0xe0 + 0x2c),Restart);
  Timer::Start((Timer *)&in_RDI[0x82].field_0x138,nowUsec_00);
  local_28 = &in_RDI->field_0x110;
  local_320 = "Reset no data timeout to ";
  local_328 = local_34c;
  local_330 = " usec";
  local_2f4 = 1;
  local_300 = "Reset no data timeout to ";
  local_310 = " usec";
  local_2e4 = 1;
  if (*(int *)&in_RDI->field_0x118 < 2) {
    local_124 = 1;
    local_130 = "Reset no data timeout to ";
    local_140 = " usec";
    buffer_00 = in_RDI;
    this_00 = (OutputWorker *)local_28;
    local_318 = local_28;
    local_308 = local_328;
    local_2f0 = local_28;
    local_2e0 = local_28;
    local_138 = local_328;
    local_120 = local_28;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,Trace);
    local_100 = &in_RDI->field_0x148;
    local_108 = local_130;
    local_110 = local_138;
    local_118 = local_140;
    local_f8 = local_2c8;
    local_f0 = local_28;
    local_e8 = local_100;
    local_e0 = local_2c8;
    local_d8 = local_28;
    local_d0 = local_100;
    local_c8 = local_2c8;
    std::operator<<(aoStack_2b8,(string *)local_100);
    local_a8 = local_f8;
    local_b0 = local_108;
    local_b8 = local_110;
    local_c0 = local_118;
    local_90 = local_f8;
    local_98 = local_108;
    local_58 = local_f8;
    local_60 = local_108;
    local_a0 = local_28;
    local_88 = local_28;
    std::operator<<((ostream *)(local_f8 + 0x10),local_108);
    local_70 = local_a8;
    local_78 = local_b8;
    local_80 = local_c0;
    local_48 = local_a8;
    local_50 = local_b8;
    local_18 = local_a8;
    local_20 = local_b8;
    local_68 = local_28;
    local_40 = local_28;
    std::ostream::operator<<((ostream *)(local_a8 + 0x10),*local_b8);
    local_30 = local_70;
    local_38 = local_80;
    local_8 = local_70;
    local_10 = local_80;
    std::operator<<((ostream *)(local_70 + 0x10),local_80);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_00,buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x19f4a0);
  }
  return;
}

Assistant:

void Connection::resetTimers(uint32_t noDataTimeoutUsec, bool connectionEstablished)
{
    const uint64_t nowUsec = GetTicksUsec();

    // Tick the no-data timeout once
    NoDataTimer.SetTimeoutUsec(noDataTimeoutUsec, Timer::Behavior::Stop);
    NoDataTimer.Start(nowUsec);

    // Tick the flow control timer repeatedly
    TimeSyncTimer.SetTimeoutUsec(
        connectionEstablished ? protocol::kTimeSyncIntervalUsec : protocol::kConnectionIntervalUsec,
        Timer::Behavior::Restart);
    TimeSyncTimer.Start(nowUsec);

    // Tick the acknowledgement timer repeatedly
    AcknowledgementTimer.SetTimeoutUsec(protocol::kMinAckIntervalUsec, Timer::Behavior::Restart);
    AcknowledgementTimer.Start(nowUsec);

    // Tick the app's OnTick() timer repeatedly
    AppTimer.SetTimeoutUsec(SocketConfig->TimerIntervalUsec, Timer::Behavior::Restart);
    AppTimer.Start(nowUsec);

    Logger.Debug("Reset no data timeout to ", noDataTimeoutUsec, " usec");
}